

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,size_t depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *head;
  pointer pcVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  cmLinkInterface *pcVar3;
  string *sourceName;
  cmSourceFile *o;
  pointer pcVar4;
  cmLinkItem *obj;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar5;
  cmLinkItem libBT;
  undefined1 local_98 [48];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  bool local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  head = (this->Targets).
         super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_start[depender_index];
  pcVar3 = cmGeneratorTarget::GetLinkInterface(dependee,config,head);
  if (pcVar3 != (cmLinkInterface *)0x0) {
    pcVar4 = (pcVar3->super_cmLinkInterfaceLibraries).Libraries.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (pcVar3->super_cmLinkInterfaceLibraries).Libraries.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar4 != pcVar1) {
      do {
        pVar5 = std::
                _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                ::_M_insert_unique<cmLinkItem_const&>
                          ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                            *)emitted,pcVar4);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_98._0_8_ = local_98 + 0x10;
          pcVar2 = (pcVar4->String)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,pcVar2,pcVar2 + (pcVar4->String)._M_string_length);
          local_98._32_4_ = *(undefined4 *)&pcVar4->Target;
          local_98._36_4_ = *(undefined4 *)((long)&pcVar4->Target + 4);
          local_98._40_4_ = *(undefined4 *)&pcVar4->ObjectSource;
          local_98._44_4_ = *(undefined4 *)((long)&pcVar4->ObjectSource + 4);
          pcVar2 = (pcVar4->Feature)._M_dataplus._M_p;
          local_68._M_p = (pointer)&local_58;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,pcVar2,pcVar2 + (pcVar4->Feature)._M_string_length);
          local_48 = pcVar4->Cross;
          local_38._M_pi =
               (pcVar4->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
            }
          }
          local_40 = (dependee_backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                     ).TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_38,
                     &(dependee_backtrace->
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          AddTargetDepend(this,depender_index,(cmLinkItem *)local_98,true,false);
          AddInterfaceDepends(this,depender_index,(cmLinkItem *)local_98,config,emitted);
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_p != &local_58) {
            operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != pcVar1);
    }
    pcVar1 = (pcVar3->super_cmLinkInterfaceLibraries).Objects.
             super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar4 = (pcVar3->super_cmLinkInterfaceLibraries).Objects.
                  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
      this_00 = head->Makefile;
      sourceName = cmLinkItem::AsStr_abi_cxx11_(pcVar4);
      o = cmMakefile::GetSource(this_00,sourceName,Known);
      if (o != (cmSourceFile *)0x0) {
        AddObjectDepends(this,depender_index,o,emitted);
      }
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  size_t depender_index, const cmGeneratorTarget* dependee,
  cmListFileBacktrace const& dependee_backtrace, const std::string& config,
  std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (cmLinkItem const& lib : iface->Libraries) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(lib).second) {
        // Inject the backtrace of the original link dependency whose
        // link interface we are adding.  This indicates the line of
        // code in the project that caused this dependency to be added.
        cmLinkItem libBT = lib;
        libBT.Backtrace = dependee_backtrace;
        this->AddTargetDepend(depender_index, libBT, true, false);
        this->AddInterfaceDepends(depender_index, libBT, config, emitted);
      }
    }
    for (cmLinkItem const& obj : iface->Objects) {
      if (cmSourceFile const* o = depender->Makefile->GetSource(
            obj.AsStr(), cmSourceFileLocationKind::Known)) {
        this->AddObjectDepends(depender_index, o, emitted);
      }
    }
  }
}